

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-dis.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppuVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  string *psVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  undefined1 local_a38 [8];
  Module wasm;
  ToolOptions options;
  Output output;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [31];
  ostream local_2c8 [272];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *local_1a0;
  size_type **local_198;
  undefined8 uStack_190;
  code *local_188;
  code *pcStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  code *local_168;
  code *local_160;
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  size_type *local_98;
  string sourceMapFilename;
  string WasmDisOption;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_98 = &sourceMapFilename._M_string_length;
  sourceMapFilename._M_dataplus._M_p = (pointer)0x0;
  sourceMapFilename._M_string_length._0_1_ = 0;
  sourceMapFilename.field_2._8_8_ = &WasmDisOption._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&sourceMapFilename.field_2 + 8),"wasm-dis options","");
  ppuVar1 = &wasm.exports.
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a38 = (undefined1  [8])ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"wasm-dis","");
  options._376_8_ = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&options.enabledFeatures,
             "Un-assemble a .wasm (WebAssembly binary format) into a .wat (WebAssembly text format)"
             ,"");
  ::wasm::ToolOptions::ToolOptions
            ((ToolOptions *)&wasm.tagsMap._M_h._M_single_bucket,(string *)local_a38,
             (string *)&options.enabledFeatures);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options._376_8_ != local_4b8) {
    operator_delete((void *)options._376_8_,local_4b8[0]._M_allocated_capacity + 1);
  }
  if (local_a38 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_a38,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  local_a38 = (undefined1  [8])ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"--output","");
  options._376_8_ = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"-o","");
  WasmDisOption.field_2._8_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmDisOption.field_2 + 8),"Output file (stdout if not specified)",""
            );
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:44:10)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:44:10)>
              ::_M_manager;
  psVar4 = (string *)
           ::wasm::Options::add
                     ((string *)&options,(string *)local_a38,(string *)&options.enabledFeatures,
                      (string *)(WasmDisOption.field_2._M_local_buf + 8),
                      (int)&sourceMapFilename + 0x18,(function *)0x1,SUB81(&local_1b8,0));
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"--source-map","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"-sm","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "Consume source map from the specified file to add location information","");
  uStack_190 = 0;
  local_198 = &local_98;
  pcStack_180 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:54:7)>
                ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:54:7)>
              ::_M_manager;
  psVar4 = (string *)
           ::wasm::Options::add
                     (psVar4,(string *)local_d8,(string *)local_158,(string *)local_b8,
                      (int)&sourceMapFilename + 0x18,(function *)0x1,SUB81(&local_198,0));
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"INFILE","");
  local_178 = 0;
  uStack_170 = 0;
  local_160 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:59:21)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-dis.cpp:59:21)>
              ::_M_manager;
  ::wasm::Options::add_positional(psVar4,(Arguments)local_138,(function *)0x1);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)WasmDisOption.field_2._8_8_ != &local_48) {
    operator_delete((void *)WasmDisOption.field_2._8_8_,local_48._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options._376_8_ != local_4b8) {
    operator_delete((void *)options._376_8_,local_4b8[0]._M_allocated_capacity + 1);
  }
  if (local_a38 !=
      (undefined1  [8])
      &wasm.exports.
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)local_a38,
                    (ulong)((long)&((wasm.exports.
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1));
  }
  ::wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  if ((char)options._vptr_ToolOptions == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"parsing binary...",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  ::wasm::Module::Module((Module *)local_a38);
  wasm.debugInfoSourcesContent.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       ~options.profile &
       ((uint)wasm.debugInfoSourcesContent.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage | options._368_4_);
  WasmDisOption.field_2._10_6_ = (uint6)((ulong)WasmDisOption.field_2._8_8_ >> 0x10) & 0xffff;
  WasmDisOption.field_2._8_2_ = 1;
  options._376_8_ = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&options.enabledFeatures,"infile","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,(key_type *)&options.enabledFeatures);
  pcVar2 = (pmVar5->_M_dataplus)._M_p;
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,pcVar2,pcVar2 + pmVar5->_M_string_length);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,local_98,sourceMapFilename._M_dataplus._M_p + (long)local_98);
  ::wasm::ModuleReader::readBinary
            ((undefined1 *)((long)&WasmDisOption.field_2 + 8),local_118,local_a38,local_f8);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)options._376_8_ != local_4b8) {
    operator_delete((void *)options._376_8_,local_4b8[0]._M_allocated_capacity + 1);
  }
  if (options.passOptions.passesToSkip._M_h._M_single_bucket._1_1_ == '\0') {
    while ((undefined8 *)wasm.typeIndices._M_h._M_bucket_count != (undefined8 *)0x0) {
      puVar3 = *(undefined8 **)wasm.typeIndices._M_h._M_bucket_count;
      operator_delete((void *)wasm.typeIndices._M_h._M_bucket_count,0x20);
      wasm.typeIndices._M_h._M_bucket_count = (size_type)puVar3;
    }
    memset(wasm.typeNames._M_h._M_single_bucket,0,(long)wasm.typeIndices._M_h._M_buckets << 3);
    wasm.typeIndices._M_h._M_bucket_count = 0;
    wasm.typeIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  }
  if ((char)options._vptr_ToolOptions != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Printing...",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  WasmDisOption.field_2._8_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&WasmDisOption.field_2 + 8),"output","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&options.super_Options,(key_type *)((long)&WasmDisOption.field_2 + 8));
  ::wasm::Output::Output((Output *)&options.enabledFeatures,(string *)pmVar5,Text);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)WasmDisOption.field_2._8_8_ != &local_48) {
    operator_delete((void *)WasmDisOption.field_2._8_8_,local_48._M_allocated_capacity + 1);
  }
  poVar6 = (ostream *)std::operator<<(local_2c8,(Module *)local_a38);
  WasmDisOption.field_2._M_local_buf[8] = 10;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,WasmDisOption.field_2._M_local_buf + 8,1);
  if ((char)options._vptr_ToolOptions == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Done.",5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  ::wasm::Output::~Output((Output *)&options.enabledFeatures);
  ::wasm::Module::~Module((Module *)local_a38);
  ::wasm::ToolOptions::~ToolOptions((ToolOptions *)&wasm.tagsMap._M_h._M_single_bucket);
  if ((size_type *)sourceMapFilename.field_2._8_8_ != &WasmDisOption._M_string_length) {
    operator_delete((void *)sourceMapFilename.field_2._8_8_,WasmDisOption._M_string_length + 1);
  }
  if (local_98 != &sourceMapFilename._M_string_length) {
    operator_delete(local_98,CONCAT71(sourceMapFilename._M_string_length._1_7_,
                                      (undefined1)sourceMapFilename._M_string_length) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string sourceMapFilename;

  const std::string WasmDisOption = "wasm-dis options";

  ToolOptions options("wasm-dis",
                      "Un-assemble a .wasm (WebAssembly binary format) into a "
                      ".wat (WebAssembly text format)");
  options
    .add("--output",
         "-o",
         "Output file (stdout if not specified)",
         WasmDisOption,
         Options::Arguments::One,
         [](Options* o, const std::string& argument) {
           o->extra["output"] = argument;
           Colors::setEnabled(false);
         })
    .add(
      "--source-map",
      "-sm",
      "Consume source map from the specified file to add location information",
      WasmDisOption,
      Options::Arguments::One,
      [&sourceMapFilename](Options* o, const std::string& argument) {
        sourceMapFilename = argument;
      })
    .add_positional("INFILE",
                    Options::Arguments::One,
                    [](Options* o, const std::string& argument) {
                      o->extra["infile"] = argument;
                    });
  options.parse(argc, argv);

  if (options.debug) {
    std::cerr << "parsing binary..." << std::endl;
  }
  Module wasm;
  options.applyOptionsBeforeParse(wasm);
  try {
    ModuleReader().readBinary(options.extra["infile"], wasm, sourceMapFilename);
  } catch (ParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    if (options.debug) {
      Fatal() << "error parsing wasm. here is what we read up to the error:\n"
              << wasm;
    } else {
      Fatal() << "error parsing wasm (try --debug for more info)";
    }
  } catch (MapParseException& p) {
    p.dump(std::cerr);
    std::cerr << '\n';
    Fatal() << "error in parsing wasm source mapping";
  }

  options.applyOptionsAfterParse(wasm);

  // TODO: Validation. However, validating would mean that users are forced to
  //       run with  wasm-dis -all  or such, to enable the features (unless the
  //       features section is present, but that's rare in general). It would be
  //       better to have an "autodetect" code path that enables used features
  //       eventually.

  if (options.debug) {
    std::cerr << "Printing..." << std::endl;
  }
  Output output(options.extra["output"], Flags::Text);
  output.getStream() << wasm << '\n';

  if (options.debug) {
    std::cerr << "Done." << std::endl;
  }
}